

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void read_film_grain(AV1_COMMON *cm,aom_read_bit_buffer *rb)

{
  long in_RDI;
  aom_read_bit_buffer *in_stack_00000058;
  AV1_COMMON *in_stack_00000060;
  
  if ((*(char *)(*(long *)(in_RDI + 0x6088) + 0x6d) == '\0') ||
     ((*(int *)(in_RDI + 0x1e0) == 0 && (*(int *)(in_RDI + 0x1e4) == 0)))) {
    memset((void *)(in_RDI + 0x5cc8),0,0x288);
  }
  else {
    read_film_grain_params(in_stack_00000060,in_stack_00000058);
  }
  *(undefined4 *)(in_RDI + 0x5f40) = *(undefined4 *)(*(long *)(in_RDI + 0x6088) + 0x48);
  memcpy((void *)(*(long *)(in_RDI + 0xe8) + 0x23c),(void *)(in_RDI + 0x5cc8),0x288);
  return;
}

Assistant:

static inline void read_film_grain(AV1_COMMON *cm,
                                   struct aom_read_bit_buffer *rb) {
  if (cm->seq_params->film_grain_params_present &&
      (cm->show_frame || cm->showable_frame)) {
    read_film_grain_params(cm, rb);
  } else {
    memset(&cm->film_grain_params, 0, sizeof(cm->film_grain_params));
  }
  cm->film_grain_params.bit_depth = cm->seq_params->bit_depth;
  memcpy(&cm->cur_frame->film_grain_params, &cm->film_grain_params,
         sizeof(aom_film_grain_t));
}